

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O3

void jsimd_h2v2_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  bool bVar1;
  JSAMPLE JVar2;
  JSAMPLE JVar3;
  JSAMPLE JVar4;
  JSAMPLE JVar5;
  JSAMPLE JVar6;
  JSAMPLE JVar7;
  JSAMPLE JVar8;
  JSAMPLE JVar9;
  JSAMPLE JVar10;
  JSAMPLE JVar11;
  JSAMPLE JVar12;
  JSAMPLE JVar13;
  JSAMPLE JVar14;
  JSAMPLE JVar15;
  JSAMPLE JVar16;
  JSAMPLE JVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  JSAMPROW pJVar21;
  JSAMPLE *pJVar22;
  JSAMPARRAY ppJVar23;
  JSAMPLE *pJVar24;
  
  if (((byte)simd_support & 0x80) != 0) {
    jsimd_h2v2_upsample_avx2();
    return;
  }
  uVar20 = (ulong)cinfo->output_width + 0x1f & 0xffffffffffffffe0;
  if ((uVar20 != 0) && ((ulong)(uint)cinfo->max_v_samp_factor != 0)) {
    ppJVar23 = *output_data_ptr;
    uVar19 = (ulong)(uint)cinfo->max_v_samp_factor;
    do {
      pJVar22 = *input_data;
      pJVar21 = *ppJVar23;
      pJVar24 = ppJVar23[1];
      uVar18 = uVar20;
      while( true ) {
        JVar2 = *pJVar22;
        JVar3 = pJVar22[1];
        JVar4 = pJVar22[2];
        JVar5 = pJVar22[3];
        JVar6 = pJVar22[4];
        JVar7 = pJVar22[5];
        JVar8 = pJVar22[6];
        JVar9 = pJVar22[7];
        JVar10 = pJVar22[8];
        JVar11 = pJVar22[9];
        JVar12 = pJVar22[10];
        JVar13 = pJVar22[0xb];
        JVar14 = pJVar22[0xc];
        JVar15 = pJVar22[0xd];
        JVar16 = pJVar22[0xe];
        JVar17 = pJVar22[0xf];
        *pJVar21 = JVar2;
        pJVar21[1] = JVar2;
        pJVar21[2] = JVar3;
        pJVar21[3] = JVar3;
        pJVar21[4] = JVar4;
        pJVar21[5] = JVar4;
        pJVar21[6] = JVar5;
        pJVar21[7] = JVar5;
        pJVar21[8] = JVar6;
        pJVar21[9] = JVar6;
        pJVar21[10] = JVar7;
        pJVar21[0xb] = JVar7;
        pJVar21[0xc] = JVar8;
        pJVar21[0xd] = JVar8;
        pJVar21[0xe] = JVar9;
        pJVar21[0xf] = JVar9;
        pJVar21[0x10] = JVar10;
        pJVar21[0x11] = JVar10;
        pJVar21[0x12] = JVar11;
        pJVar21[0x13] = JVar11;
        pJVar21[0x14] = JVar12;
        pJVar21[0x15] = JVar12;
        pJVar21[0x16] = JVar13;
        pJVar21[0x17] = JVar13;
        pJVar21[0x18] = JVar14;
        pJVar21[0x19] = JVar14;
        pJVar21[0x1a] = JVar15;
        pJVar21[0x1b] = JVar15;
        pJVar21[0x1c] = JVar16;
        pJVar21[0x1d] = JVar16;
        pJVar21[0x1e] = JVar17;
        pJVar21[0x1f] = JVar17;
        *pJVar24 = JVar2;
        pJVar24[1] = JVar2;
        pJVar24[2] = JVar3;
        pJVar24[3] = JVar3;
        pJVar24[4] = JVar4;
        pJVar24[5] = JVar4;
        pJVar24[6] = JVar5;
        pJVar24[7] = JVar5;
        pJVar24[8] = JVar6;
        pJVar24[9] = JVar6;
        pJVar24[10] = JVar7;
        pJVar24[0xb] = JVar7;
        pJVar24[0xc] = JVar8;
        pJVar24[0xd] = JVar8;
        pJVar24[0xe] = JVar9;
        pJVar24[0xf] = JVar9;
        pJVar24[0x10] = JVar10;
        pJVar24[0x11] = JVar10;
        pJVar24[0x12] = JVar11;
        pJVar24[0x13] = JVar11;
        pJVar24[0x14] = JVar12;
        pJVar24[0x15] = JVar12;
        pJVar24[0x16] = JVar13;
        pJVar24[0x17] = JVar13;
        pJVar24[0x18] = JVar14;
        pJVar24[0x19] = JVar14;
        pJVar24[0x1a] = JVar15;
        pJVar24[0x1b] = JVar15;
        pJVar24[0x1c] = JVar16;
        pJVar24[0x1d] = JVar16;
        pJVar24[0x1e] = JVar17;
        pJVar24[0x1f] = JVar17;
        if (uVar18 == 0x20) break;
        JVar2 = pJVar22[0x10];
        JVar3 = pJVar22[0x11];
        JVar4 = pJVar22[0x12];
        JVar5 = pJVar22[0x13];
        JVar6 = pJVar22[0x14];
        JVar7 = pJVar22[0x15];
        JVar8 = pJVar22[0x16];
        JVar9 = pJVar22[0x17];
        JVar10 = pJVar22[0x18];
        JVar11 = pJVar22[0x19];
        JVar12 = pJVar22[0x1a];
        JVar13 = pJVar22[0x1b];
        JVar14 = pJVar22[0x1c];
        JVar15 = pJVar22[0x1d];
        JVar16 = pJVar22[0x1e];
        JVar17 = pJVar22[0x1f];
        pJVar21[0x20] = JVar2;
        pJVar21[0x21] = JVar2;
        pJVar21[0x22] = JVar3;
        pJVar21[0x23] = JVar3;
        pJVar21[0x24] = JVar4;
        pJVar21[0x25] = JVar4;
        pJVar21[0x26] = JVar5;
        pJVar21[0x27] = JVar5;
        pJVar21[0x28] = JVar6;
        pJVar21[0x29] = JVar6;
        pJVar21[0x2a] = JVar7;
        pJVar21[0x2b] = JVar7;
        pJVar21[0x2c] = JVar8;
        pJVar21[0x2d] = JVar8;
        pJVar21[0x2e] = JVar9;
        pJVar21[0x2f] = JVar9;
        pJVar21[0x30] = JVar10;
        pJVar21[0x31] = JVar10;
        pJVar21[0x32] = JVar11;
        pJVar21[0x33] = JVar11;
        pJVar21[0x34] = JVar12;
        pJVar21[0x35] = JVar12;
        pJVar21[0x36] = JVar13;
        pJVar21[0x37] = JVar13;
        pJVar21[0x38] = JVar14;
        pJVar21[0x39] = JVar14;
        pJVar21[0x3a] = JVar15;
        pJVar21[0x3b] = JVar15;
        pJVar21[0x3c] = JVar16;
        pJVar21[0x3d] = JVar16;
        pJVar21[0x3e] = JVar17;
        pJVar21[0x3f] = JVar17;
        pJVar24[0x20] = JVar2;
        pJVar24[0x21] = JVar2;
        pJVar24[0x22] = JVar3;
        pJVar24[0x23] = JVar3;
        pJVar24[0x24] = JVar4;
        pJVar24[0x25] = JVar4;
        pJVar24[0x26] = JVar5;
        pJVar24[0x27] = JVar5;
        pJVar24[0x28] = JVar6;
        pJVar24[0x29] = JVar6;
        pJVar24[0x2a] = JVar7;
        pJVar24[0x2b] = JVar7;
        pJVar24[0x2c] = JVar8;
        pJVar24[0x2d] = JVar8;
        pJVar24[0x2e] = JVar9;
        pJVar24[0x2f] = JVar9;
        pJVar24[0x30] = JVar10;
        pJVar24[0x31] = JVar10;
        pJVar24[0x32] = JVar11;
        pJVar24[0x33] = JVar11;
        pJVar24[0x34] = JVar12;
        pJVar24[0x35] = JVar12;
        pJVar24[0x36] = JVar13;
        pJVar24[0x37] = JVar13;
        pJVar24[0x38] = JVar14;
        pJVar24[0x39] = JVar14;
        pJVar24[0x3a] = JVar15;
        pJVar24[0x3b] = JVar15;
        pJVar24[0x3c] = JVar16;
        pJVar24[0x3d] = JVar16;
        pJVar24[0x3e] = JVar17;
        pJVar24[0x3f] = JVar17;
        uVar18 = uVar18 - 0x40;
        if (uVar18 == 0) break;
        pJVar22 = pJVar22 + 0x20;
        pJVar21 = pJVar21 + 0x40;
        pJVar24 = pJVar24 + 0x40;
      }
      input_data = input_data + 1;
      ppJVar23 = ppJVar23 + 2;
      uVar18 = uVar19 - 2;
      bVar1 = 1 < (long)uVar19;
      uVar19 = uVar18;
    } while (uVar18 != 0 && bVar1);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v2_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_h2v2_upsample_avx2(cinfo->max_v_samp_factor, cinfo->output_width,
                             input_data, output_data_ptr);
  else
    jsimd_h2v2_upsample_sse2(cinfo->max_v_samp_factor, cinfo->output_width,
                             input_data, output_data_ptr);
}